

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O3

var __thiscall cs::make_cni<char(&)(char)>(cs *this,_func_char_char *func,bool request_fold)

{
  undefined7 in_register_00000011;
  cni local_20;
  types local_14;
  
  local_20.mCni =
       cs_impl::cni::construct_helper<char(*)(char)>::_construct<char(&)(char),char,char>
                 (func,(_func_char_char *)0x0);
  local_14 = (types)CONCAT71(in_register_00000011,request_fold);
  cs_impl::any::make_protect<cs::callable,cs_impl::cni,cs::callable::types>
            ((any *)this,&local_20,&local_14);
  if (local_20.mCni != (cni_holder_base *)0x0) {
    (*(local_20.mCni)->_vptr_cni_holder_base[1])();
  }
  return (var)(proxy *)this;
}

Assistant:

var make_cni(T &&func, bool request_fold = false)
	{
		return var::make_protect<callable>(cni(func),
		                                   request_fold ? callable::types::request_fold : callable::types::normal);
	}